

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Token *token)

{
  ostream *poVar1;
  Token *token_local;
  ostream *stream_local;
  
  if (((((token->type == Number) || (token->type == String)) || (token->type == Boolean)) ||
      ((token->type == Char || (token->type == Name)))) ||
     ((token->type == Method || ((token->type == HeaderKey || (token->type == HeaderValue)))))) {
    poVar1 = std::operator<<(stream,"Token ");
    poVar1 = operator<<(poVar1,&token->type);
    poVar1 = std::operator<<(poVar1,"=");
    stream_local = operator<<(poVar1,&token->value);
  }
  else if (token->type == HeaderOpener) {
    poVar1 = std::operator<<(stream,"Token ");
    poVar1 = operator<<(poVar1,&token->value);
    stream_local = operator<<(poVar1,&token->type);
  }
  else if (token->type == HeaderCloser) {
    poVar1 = std::operator<<(stream,"Token ");
    poVar1 = operator<<(poVar1,&token->type);
    stream_local = operator<<(poVar1,&token->value);
  }
  else {
    poVar1 = std::operator<<(stream,"Token ");
    stream_local = operator<<(poVar1,&token->type);
  }
  return stream_local;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Token &token) {
    if (token.type == Number || token.type == String || token.type == Boolean ||
        token.type == Char || token.type == Name || token.type == Method || token.type == HeaderKey ||
        token.type == HeaderValue)
        return stream << "Token " << token.type << "=" << token.value;
    else if (token.type == HeaderOpener)
        return stream << "Token " << token.value << token.type;
    else if (token.type == HeaderCloser)
        return stream << "Token " << token.type << token.value;
    else
        return stream << "Token " << token.type;

}